

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dht_tracker.cpp
# Opt level: O2

void __thiscall
libtorrent::dht::dht_tracker::update_node_id(dht_tracker *this,listen_socket_handle *s)

{
  iterator iVar1;
  
  iVar1 = ::std::
          _Rb_tree<libtorrent::aux::listen_socket_handle,_std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>,_std::_Select1st<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>,_std::less<libtorrent::aux::listen_socket_handle>,_std::allocator<std::pair<const_libtorrent::aux::listen_socket_handle,_libtorrent::dht::dht_tracker::tracker_node>_>_>
          ::find(&(this->m_nodes)._M_t,s);
  if ((_Rb_tree_header *)iVar1._M_node != &(this->m_nodes)._M_t._M_impl.super__Rb_tree_header) {
    dht::node::update_node_id((node *)&iVar1._M_node[1]._M_left);
  }
  update_storage_node_ids(this);
  return;
}

Assistant:

void dht_tracker::update_node_id(aux::listen_socket_handle const& s)
	{
		auto n = m_nodes.find(s);
		if (n != m_nodes.end())
			n->second.dht.update_node_id();
		update_storage_node_ids();
	}